

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_conv_1d_2s(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  undefined8 uVar2;
  char *pcVar3;
  int ne [4];
  
  if ((b->ne[2] == 1) && (b->ne[3] == 1)) {
    if (a->ne[1] == b->ne[1]) {
      if (a->ne[3] == 1) {
        if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
          ne[0] = b->ne[0] / 2;
          ne[1] = a->ne[2];
          ne[2] = 1;
          ne[3] = 1;
          pgVar1 = ggml_new_tensor(ctx,GGML_TYPE_F32,2,ne);
          pgVar1->op = GGML_OP_CONV_1D_2S;
          pgVar1->grad = (ggml_tensor *)0x0;
          pgVar1->src0 = a;
          pgVar1->src1 = b;
          return pgVar1;
        }
        pcVar3 = "false";
        uVar2 = 0x1025;
      }
      else {
        pcVar3 = "a->ne[3] == 1";
        uVar2 = 0x1021;
      }
    }
    else {
      pcVar3 = "a->ne[1] == b->ne[1]";
      uVar2 = 0x1020;
    }
  }
  else {
    pcVar3 = "ggml_is_matrix(b)";
    uVar2 = 0x101f;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar2,
          pcVar3);
  abort();
}

Assistant:

struct ggml_tensor * ggml_conv_1d_2s(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_is_matrix(b));
    GGML_ASSERT(a->ne[1] == b->ne[1]);
    GGML_ASSERT(a->ne[3] == 1);
    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    const int ne[4] = { b->ne[0]/2, a->ne[2], 1, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 2, ne);

    result->op   = GGML_OP_CONV_1D_2S;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}